

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
CartesianProductGenerator<(anonymous_namespace)::TextureSet,(anonymous_namespace)::FormatFeature>::
IteratorImpl<testing::internal::IndexSequence<0ul,1ul>>::AdvanceIfEnd<1ul>
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *this)

{
  bool bVar1;
  __tuple_element_t<1UL,_tuple<ParamIterator<TextureSet>,_ParamIterator<FormatFeature>_>_> *this_00;
  size_t NextI;
  bool last;
  ParamIterator<(anonymous_namespace)::FormatFeature> *in_stack_ffffffffffffffc8;
  ParamIterator<(anonymous_namespace)::FormatFeature> *in_stack_ffffffffffffffd0;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 uVar2;
  
  std::
  get<1ul,testing::internal::ParamIterator<(anonymous_namespace)::TextureSet>,testing::internal::ParamIterator<(anonymous_namespace)::FormatFeature>>
            ((tuple<testing::internal::ParamIterator<(anonymous_namespace)::TextureSet>,_testing::internal::ParamIterator<(anonymous_namespace)::FormatFeature>_>
              *)0x1147bc);
  std::
  get<1ul,testing::internal::ParamIterator<(anonymous_namespace)::TextureSet>,testing::internal::ParamIterator<(anonymous_namespace)::FormatFeature>>
            ((tuple<testing::internal::ParamIterator<(anonymous_namespace)::TextureSet>,_testing::internal::ParamIterator<(anonymous_namespace)::FormatFeature>_>
              *)0x1147cf);
  bVar1 = ParamIterator<(anonymous_namespace)::FormatFeature>::operator!=
                    (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (!bVar1) {
    uVar2 = 0;
    this_00 = std::
              get<1ul,testing::internal::ParamIterator<(anonymous_namespace)::TextureSet>,testing::internal::ParamIterator<(anonymous_namespace)::FormatFeature>>
                        ((tuple<testing::internal::ParamIterator<(anonymous_namespace)::TextureSet>,_testing::internal::ParamIterator<(anonymous_namespace)::FormatFeature>_>
                          *)0x114809);
    std::
    get<1ul,testing::internal::ParamIterator<(anonymous_namespace)::TextureSet>,testing::internal::ParamIterator<(anonymous_namespace)::FormatFeature>>
              ((tuple<testing::internal::ParamIterator<(anonymous_namespace)::TextureSet>,_testing::internal::ParamIterator<(anonymous_namespace)::FormatFeature>_>
                *)0x11481c);
    ParamIterator<(anonymous_namespace)::FormatFeature>::operator=
              (this_00,in_stack_ffffffffffffffc8);
    std::
    get<0ul,testing::internal::ParamIterator<(anonymous_namespace)::TextureSet>,testing::internal::ParamIterator<(anonymous_namespace)::FormatFeature>>
              ((tuple<testing::internal::ParamIterator<(anonymous_namespace)::TextureSet>,_testing::internal::ParamIterator<(anonymous_namespace)::FormatFeature>_>
                *)0x114837);
    ParamIterator<(anonymous_namespace)::TextureSet>::operator++
              ((ParamIterator<(anonymous_namespace)::TextureSet> *)this_00);
    AdvanceIfEnd<0ul>((IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *)
                      CONCAT17(uVar2,in_stack_fffffffffffffff0));
  }
  return;
}

Assistant:

void AdvanceIfEnd() {
      if (std::get<ThisI>(current_) != std::get<ThisI>(end_)) return;

      bool last = ThisI == 0;
      if (last) {
        // We are done. Nothing else to propagate.
        return;
      }

      constexpr size_t NextI = ThisI - (ThisI != 0);
      std::get<ThisI>(current_) = std::get<ThisI>(begin_);
      ++std::get<NextI>(current_);
      AdvanceIfEnd<NextI>();
    }